

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deProcess.c
# Opt level: O3

deBool deProcess_start(deProcess *process,char *commandLine,char *workingDirectory)

{
  size_t numBytes;
  int iVar1;
  __pid_t __pid;
  deBool dVar2;
  long lVar3;
  int *piVar4;
  ssize_t sVar5;
  deFile *pdVar6;
  deCommandLine *pdVar7;
  char **__argv;
  char **extraout_RAX;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  uint __fd;
  char *pcVar13;
  size_t sVar14;
  int statusPipe [2];
  int pipeErr [2];
  int pipeOut [2];
  int pipeIn [2];
  int procStatus;
  char errBuf [256];
  int local_150 [9];
  int local_12c;
  char local_128 [256];
  
  local_150[6] = -1;
  local_150[7] = -1;
  local_150[4] = -1;
  local_150[5] = -1;
  local_150[2] = -1;
  local_150[3] = -1;
  local_150[0] = -1;
  local_150[1] = -1;
  if (process->state == PROCESSSTATE_FINISHED) {
    deProcess_cleanupHandles(process);
    process->state = PROCESSSTATE_NOT_STARTED;
  }
  else if (process->state == PROCESSSTATE_RUNNING) {
    deProcess_setError(process,"Process already running");
    return 0;
  }
  iVar1 = pipe(local_150 + 6);
  if ((((iVar1 < 0) || (iVar1 = pipe(local_150 + 4), iVar1 < 0)) ||
      (iVar1 = pipe(local_150 + 2), iVar1 < 0)) || (iVar1 = pipe(local_150), iVar1 < 0)) {
    pcVar13 = "pipe() failed";
LAB_0013b0f3:
    deProcess_setErrorFromErrno(process,pcVar13);
    closePipe(local_150 + 6);
    closePipe(local_150 + 4);
    closePipe(local_150 + 2);
    closePipe(local_150);
    return 0;
  }
  __pid = fork();
  if (__pid < 0) {
    pcVar13 = "fork() failed";
    goto LAB_0013b0f3;
  }
  if (__pid != 0) {
    close(local_150[1]);
    lVar3 = read(local_150[0],local_128,1);
    if (lVar3 == -1) {
      piVar4 = __errno_location();
      do {
        if ((*piVar4 != 0xb) && (*piVar4 != 4)) goto LAB_0013b140;
        lVar3 = read(local_150[0],local_128,1);
      } while (lVar3 == -1);
    }
    if (lVar3 < 1) {
LAB_0013b140:
      close(local_150[0]);
      process->pid = __pid;
      process->state = PROCESSSTATE_RUNNING;
      close(local_150[6]);
      close(local_150[5]);
      close(local_150[3]);
      pdVar6 = deFile_createFromHandle((long)local_150[7]);
      process->standardIn = pdVar6;
      pdVar6 = deFile_createFromHandle((long)local_150[4]);
      process->standardOut = pdVar6;
      pdVar6 = deFile_createFromHandle((long)local_150[2]);
      process->standardErr = pdVar6;
      if (process->standardIn == (deFile *)0x0) {
        close(local_150[7]);
      }
      if (process->standardOut == (deFile *)0x0) {
        close(local_150[4]);
      }
      if (process->standardErr == (deFile *)0x0) {
        close(local_150[2]);
        return 1;
      }
      return 1;
    }
    local_12c = 0;
    uVar12 = 1;
    do {
      sVar5 = read(local_150[0],local_128 + uVar12,1);
      if (sVar5 == -1) goto LAB_0013b09f;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 0x100);
    uVar12 = 0x100;
LAB_0013b09f:
    local_128[uVar12 & 0xffffffff] = '\0';
    close(local_150[0]);
    closePipe(local_150 + 6);
    closePipe(local_150 + 4);
    closePipe(local_150 + 2);
    waitpid(__pid,&local_12c,0);
    deProcess_setError(process,local_128);
    return 0;
  }
  close(local_150[7]);
  close(local_150[4]);
  close(local_150[2]);
  close(local_150[0]);
  __fd = 0;
  iVar1 = fcntl(local_150[1],2,1);
  if (iVar1 == 0) {
    pdVar7 = (deCommandLine *)commandLine;
    if (local_150[6] == 0) {
LAB_0013b235:
      close(__fd);
      iVar1 = 1;
      if (local_150[5] != 1) {
        iVar1 = dup2(local_150[5],1);
        if (iVar1 != 1) goto LAB_0013b2d3;
        iVar1 = local_150[5];
      }
      close(iVar1);
      iVar1 = 2;
      if (local_150[3] != 2) {
        iVar1 = dup2(local_150[3],2);
        if (iVar1 != 2) goto LAB_0013b2d3;
        iVar1 = local_150[3];
      }
      close(iVar1);
      __fd = local_150[1];
      pdVar7 = deCommandLine_parse(commandLine);
      if ((pdVar7 != (deCommandLine *)0x0) &&
         (__argv = (char **)deCalloc((long)pdVar7->numArgs * 8 + 8), commandLine = (char *)pdVar7,
         __argv != (char **)0x0)) goto LAB_0013b2e3;
      die(__fd,"Command line parsing failed (out of memory)");
      goto LAB_0013b2c3;
    }
    iVar1 = dup2(local_150[6],0);
    if (iVar1 == 0) {
      __fd = local_150[6];
      goto LAB_0013b235;
    }
  }
  else {
LAB_0013b2c3:
    dieLastError(local_150[1],"Failed to set FD_CLOEXEC");
    pdVar7 = (deCommandLine *)commandLine;
  }
LAB_0013b2d3:
  dieLastError(local_150[1],"dup2() failed");
  __argv = extraout_RAX;
LAB_0013b2e3:
  if ((workingDirectory == (char *)0x0) || (iVar1 = chdir(workingDirectory), iVar1 == 0)) {
    lVar3 = (long)pdVar7->numArgs;
    if (lVar3 < 1) {
      lVar3 = 0;
    }
    else {
      lVar11 = 0;
      do {
        __argv[lVar11] = pdVar7->args[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar3 != lVar11);
    }
    __argv[lVar3] = (char *)0x0;
    if (workingDirectory != (char *)0x0) {
      pcVar13 = *__argv;
      sVar8 = strlen(workingDirectory);
      sVar9 = sVar8 + 1;
      do {
        if (sVar9 == 1) goto LAB_0013b32a;
        numBytes = sVar9 - 1;
        lVar3 = sVar9 - 2;
        sVar9 = numBytes;
      } while (workingDirectory[lVar3] == '/');
      dVar2 = deMemoryEqual(pcVar13,workingDirectory,numBytes);
      if ((dVar2 != 0) && (pcVar13[numBytes] == '/')) {
        pcVar13 = *__argv;
        sVar8 = strlen(workingDirectory);
        sVar10 = strlen(pcVar13);
        do {
          sVar14 = sVar8;
          if (sVar14 == 0) break;
          sVar8 = sVar14 - 1;
        } while (workingDirectory[sVar14 - 1] == '/');
        memmove(pcVar13,pcVar13 + sVar14 + 1,sVar10 - sVar14);
      }
    }
LAB_0013b32a:
    execv(*__argv,__argv);
    pcVar13 = "execv() failed";
  }
  else {
    pcVar13 = "chdir() failed";
  }
  uVar12 = (ulong)__fd;
  dieLastError(__fd,pcVar13);
  if (*(void **)(uVar12 + 8) != (void *)0x0) {
    deFree(*(void **)(uVar12 + 8));
    *(undefined8 *)(uVar12 + 8) = 0;
  }
  pcVar13 = deStrdup(pcVar13);
  *(char **)(uVar12 + 8) = pcVar13;
  return (deBool)pcVar13;
}

Assistant:

deBool deProcess_start (deProcess* process, const char* commandLine, const char* workingDirectory)
{
	pid_t		pid				= 0;
	int			pipeIn[2]		= { -1, -1 };
	int			pipeOut[2]		= { -1, -1 };
	int			pipeErr[2]		= { -1, -1 };
	int			statusPipe[2]	= { -1, -1 };

	if (process->state == PROCESSSTATE_RUNNING)
	{
		deProcess_setError(process, "Process already running");
		return DE_FALSE;
	}
	else if (process->state == PROCESSSTATE_FINISHED)
	{
		deProcess_cleanupHandles(process);
		process->state = PROCESSSTATE_NOT_STARTED;
	}

	if (pipe(pipeIn) < 0 || pipe(pipeOut) < 0 || pipe(pipeErr) < 0 || pipe(statusPipe) < 0)
	{
		deProcess_setErrorFromErrno(process, "pipe() failed");

		closePipe(pipeIn);
		closePipe(pipeOut);
		closePipe(pipeErr);
		closePipe(statusPipe);

		return DE_FALSE;
	}

	pid = fork();

	if (pid < 0)
	{
		deProcess_setErrorFromErrno(process, "fork() failed");

		closePipe(pipeIn);
		closePipe(pipeOut);
		closePipe(pipeErr);
		closePipe(statusPipe);

		return DE_FALSE;
	}

	if (pid == 0)
	{
		/* Child process. */

		/* Close unused endpoints. */
		close(pipeIn[1]);
		close(pipeOut[0]);
		close(pipeErr[0]);
		close(statusPipe[0]);

		/* Set status pipe to close on exec(). That way parent will know that exec() succeeded. */
		if (fcntl(statusPipe[1], F_SETFD, FD_CLOEXEC) != 0)
			dieLastError(statusPipe[1], "Failed to set FD_CLOEXEC");

		/* Map stdin. */
		if (pipeIn[0] != STDIN_FILENO &&
			dup2(pipeIn[0], STDIN_FILENO) != STDIN_FILENO)
			dieLastError(statusPipe[1], "dup2() failed");
		close(pipeIn[0]);

		/* Stdout. */
		if (pipeOut[1] != STDOUT_FILENO &&
			dup2(pipeOut[1], STDOUT_FILENO) != STDOUT_FILENO)
			dieLastError(statusPipe[1], "dup2() failed");
		close(pipeOut[1]);

		/* Stderr. */
		if (pipeErr[1] != STDERR_FILENO &&
			dup2(pipeErr[1], STDERR_FILENO) != STDERR_FILENO)
			dieLastError(statusPipe[1], "dup2() failed");
		close(pipeErr[1]);

		/* Doesn't return. */
		execProcess(commandLine, workingDirectory, statusPipe[1]);
	}
	else
	{
		/* Parent process. */

		/* Check status. */
		{
			char	errBuf[256];
			ssize_t	result = 0;

			close(statusPipe[1]);
			while ((result = read(statusPipe[0], errBuf, 1)) == -1)
				if (errno != EAGAIN && errno != EINTR) break;

			if (result > 0)
			{
				int procStatus = 0;

				/* Read full error msg. */
				int errPos = 1;
				while (errPos < DE_LENGTH_OF_ARRAY(errBuf))
				{
					result = read(statusPipe[0], errBuf+errPos, 1);
					if (result == -1)
						break; /* Done. */

					errPos += 1;
				}

				/* Make sure str is null-terminated. */
				errBuf[errPos] = 0;

				/* Close handles. */
				close(statusPipe[0]);
				closePipe(pipeIn);
				closePipe(pipeOut);
				closePipe(pipeErr);

				/* Run waitpid to clean up zombie. */
				waitpid(pid, &procStatus, 0);

				deProcess_setError(process, errBuf);

				return DE_FALSE;
			}

			/* Status pipe is not needed. */
			close(statusPipe[0]);
		}

		/* Set running state. */
		process->pid		= pid;
		process->state		= PROCESSSTATE_RUNNING;

		/* Stdin, stdout. */
		close(pipeIn[0]);
		close(pipeOut[1]);
		close(pipeErr[1]);

		process->standardIn		= deFile_createFromHandle((deUintptr)pipeIn[1]);
		process->standardOut	= deFile_createFromHandle((deUintptr)pipeOut[0]);
		process->standardErr	= deFile_createFromHandle((deUintptr)pipeErr[0]);

		if (!process->standardIn)
			close(pipeIn[1]);

		if (!process->standardOut)
			close(pipeOut[0]);

		if (!process->standardErr)
			close(pipeErr[0]);
	}

	return DE_TRUE;
}